

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O0

void CoreML::Specification::CoreMLModels::protobuf_AudioFeaturePrint_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/AudioFeaturePrint.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound>
                    *)_AudioFeaturePrint_Sound_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::AudioFeaturePrint>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::AudioFeaturePrint> *)
             _AudioFeaturePrint_default_instance_);
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _AudioFeaturePrint_Sound_default_instance_.DefaultConstruct();
  _AudioFeaturePrint_default_instance_.DefaultConstruct();
}